

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O3

Sentence * jhu::thrax::tokens<true>(Sentence *__return_storage_ptr__,string_view line)

{
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  _Var1;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *t;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  size_t sVar3;
  string_view line_00;
  
  line_00._M_len = line._M_str;
  line_00._M_str = in_RCX;
  split(__return_storage_ptr__,(thrax *)line._M_len,line_00);
  _Var1 = std::
          __remove_if<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::tokens<true>(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                    ((__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  pbVar2 = (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (_Var1._M_current !=
      (__return_storage_ptr__->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = _Var1._M_current;
  }
  do {
    if (pbVar2 == _Var1._M_current) {
      return __return_storage_ptr__;
    }
    sVar3 = pbVar2->_M_len;
    if (sVar3 != 0) {
      do {
        sVar3 = sVar3 - 1;
        if (pbVar2->_M_str[sVar3] != ')') break;
        pbVar2->_M_len = sVar3;
      } while (sVar3 != 0);
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

Sentence tokens(std::string_view line) {
  auto sentence = split(line);
  if constexpr (!IsParsed) {
    return sentence;
  }
  auto it = std::remove_if(
      sentence.begin(),
      sentence.end(),
      [](auto t) { return t.front() == '('; });
  sentence.erase(it, sentence.end());
  for (auto& t : sentence) {
    while (!t.empty() && t.back() == ')') {
      t.remove_suffix(1);
    }
  }
  return sentence;
}